

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::texImage3D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int width,
          int height,int depth,int border,deUint32 format,deUint32 type,void *data)

{
  DataBuffer *pDVar1;
  pointer puVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  TextureFormat *pTVar6;
  PixelBufferAccess *pPVar7;
  TextureFormat TVar8;
  Texture2D *pTVar9;
  long lVar10;
  Texture3D *pTVar11;
  Texture2DArray *pTVar12;
  TextureCubeArray *pTVar13;
  TextureCube *pTVar14;
  uint uVar15;
  pointer puVar16;
  Texture1D *pTVar17;
  ConstPixelBufferAccess src;
  TextureFormat local_190;
  undefined8 local_188;
  TextureFormat local_180;
  undefined8 local_178;
  undefined4 auStack_170 [6];
  void *local_158;
  pointer local_150;
  ConstPixelBufferAccess local_148;
  PixelBufferAccess local_120;
  PixelBufferAccess local_f8;
  PixelBufferAccess local_d0;
  PixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  pDVar1 = this->m_pixelUnpackBufferBinding;
  if (pDVar1 != (DataBuffer *)0x0) {
    puVar2 = (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar16 = (pointer)0x0;
    if (puVar2 != (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      puVar16 = puVar2;
    }
    data = (void *)((long)data + (long)puVar16);
  }
  local_188 = (this->m_textureUnits).
              super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  local_190.order = CHANNELORDER_LAST;
  local_190.type = CHANNELTYPE_LAST;
  local_180.order = CHANNELORDER_LAST;
  local_180.type = CHANNELTYPE_LAST;
  if ((border != 0) || ((width | level | height | depth) < 0)) goto LAB_018d490d;
  local_150 = (pointer)data;
  local_190 = mapInternalFormat(internalFormat);
  if ((local_190.order == CHANNELORDER_LAST) ||
     (((local_190.type == CHANNELTYPE_LAST ||
       (local_180 = glu::mapGLTransferFormat(format,type), local_180.order == CHANNELORDER_LAST)) ||
      (local_180.type == CHANNELTYPE_LAST)))) {
LAB_018d4ae4:
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  uVar15 = internalFormat & 0xfffffffe;
  if (target == 0xde1) {
    uVar5 = (this->m_limits).maxTexture2DSize;
    if ((width <= (int)uVar5) && (depth == 1 && height <= (int)uVar5)) {
      if (uVar5 == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = uVar4 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar4)) {
        pTVar9 = &local_188->default2DTex;
        if (local_188->tex2DBinding != (Texture2D *)0x0) {
          pTVar9 = local_188->tex2DBinding;
        }
        if ((pTVar9->super_Texture).m_immutable == true) {
          if (((0xd < (uint)level) ||
              (*(long *)((long)((pTVar9->m_levels).m_data + (uint)level) + 8) == 0)) ||
             ((uVar3 = *(undefined8 *)((pTVar9->m_levels).m_access + (uint)level),
              local_190.order != (ChannelOrder)uVar3 ||
              (((local_190.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                (*(int *)((long)((pTVar9->m_levels).m_access + (uint)level) + 8) != width)) ||
               (*(int *)((long)((pTVar9->m_levels).m_access + (uint)level) + 0xc) != height))))))
          goto LAB_018d538d;
        }
        else {
          rc::TextureLevelArray::allocLevel(&pTVar9->m_levels,level,&local_190,width,height,1);
        }
        if (local_150 != (pointer)0x0) {
          getUnpack2DAccess(&local_148,this,&local_180,width,height,local_150);
          pPVar7 = (pTVar9->m_levels).m_access + level;
          local_178 = (pPVar7->super_ConstPixelBufferAccess).m_format;
          lVar10 = 0;
          do {
            auStack_170[lVar10] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            auStack_170[lVar10 + 3] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 0x14);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          goto LAB_018d5441;
        }
        pTVar6 = (TextureFormat *)((pTVar9->m_levels).m_access + level);
        local_80.super_ConstPixelBufferAccess.m_format = *pTVar6;
        lVar10 = 0;
        do {
          local_80.super_ConstPixelBufferAccess.m_size.m_data[lVar10] = (&pTVar6[1].order)[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          local_80.super_ConstPixelBufferAccess.m_pitch.m_data[lVar10] = (&pTVar6[2].type)[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        TVar8 = pTVar6[4];
        pPVar7 = &local_80;
LAB_018d5570:
        (pPVar7->super_ConstPixelBufferAccess).m_data = (void *)TVar8;
        clearToTextureInitialValue(pPVar7);
        return;
      }
    }
  }
  else {
    if ((target == 0xde0) && (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) == 0x100))
    {
      if (((depth == 1) && (height == 1)) &&
         (uVar5 = (this->m_limits).maxTexture2DSize, width <= (int)uVar5)) {
        if (uVar5 == 0) {
          uVar4 = 0x20;
        }
        else {
          uVar4 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = uVar4 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar4)) {
          pTVar17 = &local_188->default1DTex;
          if (local_188->tex1DBinding != (Texture1D *)0x0) {
            pTVar17 = local_188->tex1DBinding;
          }
          if ((pTVar17->super_Texture).m_immutable == true) {
            if (((0xd < (uint)level) ||
                (*(long *)((long)((pTVar17->m_levels).m_data + (uint)level) + 8) == 0)) ||
               ((uVar3 = *(undefined8 *)((pTVar17->m_levels).m_access + (uint)level),
                local_190.order != (ChannelOrder)uVar3 ||
                ((local_190.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                 (*(int *)((long)((pTVar17->m_levels).m_access + (uint)level) + 8) != width))))))
            goto LAB_018d538d;
          }
          else {
            rc::TextureLevelArray::allocLevel(&pTVar17->m_levels,level,&local_190,width,1,1);
          }
          if (local_150 == (pointer)0x0) {
            local_58.super_ConstPixelBufferAccess.m_format =
                 *(TextureFormat *)((pTVar17->m_levels).m_access + level);
            lVar10 = 0;
            do {
              local_58.super_ConstPixelBufferAccess.m_size.m_data[lVar10] =
                   *(int *)((long)((pTVar17->m_levels).m_access + level) + 8U + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            lVar10 = 0;
            do {
              local_58.super_ConstPixelBufferAccess.m_pitch.m_data[lVar10] =
                   *(int *)((long)((pTVar17->m_levels).m_access + level) + 0x14U + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            TVar8 = *(TextureFormat *)((long)((pTVar17->m_levels).m_access + level) + 0x20);
            pPVar7 = &local_58;
            goto LAB_018d5570;
          }
          getUnpack2DAccess(&local_148,this,&local_180,width,1,local_150);
          pPVar7 = (pTVar17->m_levels).m_access + level;
          local_178 = (pPVar7->super_ConstPixelBufferAccess).m_format;
          lVar10 = 0;
          do {
            auStack_170[lVar10] =
                 *(undefined4 *)((long)((pTVar17->m_levels).m_access + level) + 8U + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            auStack_170[lVar10 + 3] =
                 *(undefined4 *)((long)((pTVar17->m_levels).m_access + level) + 0x14U + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          goto LAB_018d5441;
        }
      }
      goto LAB_018d490d;
    }
    if (target - 0x8515 < 6) {
      if ((width == height) &&
         (uVar15 = (this->m_limits).maxTextureCubeSize, depth == 1 && width <= (int)uVar15)) {
        if (uVar15 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar15 != 0) {
            for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar5)) {
          pTVar14 = &local_188->defaultCubeTex;
          if (local_188->texCubeBinding != (TextureCube *)0x0) {
            pTVar14 = local_188->texCubeBinding;
          }
          lVar10 = 6;
          if ((ushort)(target + 0x7aeb) < 6) {
            lVar10 = *(long *)(&DAT_01cf7258 + (ulong)(target + 0x7aeb & 0xffff) * 8);
          }
          if ((pTVar14->super_Texture).m_immutable == true) {
            if ((0xd < (uint)level) ||
               (*(long *)((long)(pTVar14->m_levels[lVar10].m_data + (uint)level) + 8) == 0)) {
LAB_018d538d:
              if (this->m_lastError != 0) {
                return;
              }
              this->m_lastError = 0x502;
              return;
            }
            local_188 = (pointer)(CONCAT44(local_188._4_4_,internalFormat) & 0xfffffffffffffffe);
            uVar3 = pTVar14->m_levels[lVar10].m_access[(uint)level].super_ConstPixelBufferAccess.
                    m_format;
            if ((local_190.order != (ChannelOrder)uVar3) ||
               (((local_190.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                 (*(int *)((long)(pTVar14->m_levels[lVar10].m_access + (uint)level) + 8) != width))
                || (*(int *)((long)(pTVar14->m_levels[lVar10].m_access + (uint)level) + 0xc) !=
                    height)))) goto LAB_018d538d;
          }
          else {
            local_188 = (pointer)(CONCAT44(local_188._4_4_,internalFormat) & 0xfffffffffffffffe);
            rc::TextureLevelArray::allocLevel
                      (pTVar14->m_levels + lVar10,level,&local_190,width,height,1);
          }
          if (local_150 == (pointer)0x0) {
            pTVar6 = (TextureFormat *)(pTVar14->m_levels[lVar10].m_access + level);
            local_a8.super_ConstPixelBufferAccess.m_format = *pTVar6;
            lVar10 = 0;
            do {
              local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar10] =
                   (&pTVar6[1].order)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            lVar10 = 0;
            do {
              local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[lVar10] =
                   (&pTVar6[2].type)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            TVar8 = pTVar6[4];
            pPVar7 = &local_a8;
            goto LAB_018d5570;
          }
          getUnpack2DAccess(&local_148,this,&local_180,width,height,local_150);
          pPVar7 = pTVar14->m_levels[lVar10].m_access + level;
          local_178 = (pPVar7->super_ConstPixelBufferAccess).m_format;
          lVar10 = 0;
          do {
            auStack_170[lVar10] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            auStack_170[lVar10 + 3] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 0x14);
            lVar10 = lVar10 + 1;
            uVar15 = (uint)local_188;
          } while (lVar10 != 3);
LAB_018d5441:
          local_158 = *(void **)((long)&pPVar7->super_ConstPixelBufferAccess + 0x20);
          if (uVar15 == 0x8cac) {
            depthValueFloatClampCopy((PixelBufferAccess *)&local_178,&local_148);
            return;
          }
          tcu::copy((EVP_PKEY_CTX *)&local_178,(EVP_PKEY_CTX *)&local_148);
          return;
        }
      }
    }
    else if (target == 0x806f) {
      uVar5 = (this->m_limits).maxTexture3DSize;
      if (((depth <= (int)uVar5) && (width <= (int)uVar5)) && (height <= (int)uVar5)) {
        if (uVar5 == 0) {
          uVar4 = 0x20;
        }
        else {
          uVar4 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = uVar4 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar4)) {
          pTVar11 = &local_188->default3DTex;
          if (local_188->tex3DBinding != (Texture3D *)0x0) {
            pTVar11 = local_188->tex3DBinding;
          }
          if ((pTVar11->super_Texture).m_immutable == true) {
            if ((((((0xd < (uint)level) ||
                   (*(long *)((long)((pTVar11->m_levels).m_data + (uint)level) + 8) == 0)) ||
                  (uVar3 = *(undefined8 *)((pTVar11->m_levels).m_access + (uint)level),
                  local_190.order != (ChannelOrder)uVar3)) ||
                 ((local_190.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                  (*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 8) != width)))) ||
                (*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 0xc) != height)) ||
               (*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 0x10) != depth))
            goto LAB_018d538d;
          }
          else {
            rc::TextureLevelArray::allocLevel
                      (&pTVar11->m_levels,level,&local_190,width,height,depth);
          }
          if (local_150 == (pointer)0x0) {
            pTVar6 = (TextureFormat *)((pTVar11->m_levels).m_access + level);
            local_f8.super_ConstPixelBufferAccess.m_format = *pTVar6;
            lVar10 = 0;
            do {
              local_f8.super_ConstPixelBufferAccess.m_size.m_data[lVar10] =
                   (&pTVar6[1].order)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            lVar10 = 0;
            do {
              local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[lVar10] =
                   (&pTVar6[2].type)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            TVar8 = pTVar6[4];
            pPVar7 = &local_f8;
            goto LAB_018d5570;
          }
          getUnpack3DAccess(&local_148,this,&local_180,width,height,depth,local_150);
          pPVar7 = (pTVar11->m_levels).m_access + level;
          local_178 = (pPVar7->super_ConstPixelBufferAccess).m_format;
          lVar10 = 0;
          do {
            auStack_170[lVar10] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            auStack_170[lVar10 + 3] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 0x14);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          goto LAB_018d5441;
        }
      }
    }
    else if (target == 0x9009) {
      if (((width == height) &&
          (((uint)(depth * -0x55555555) >> 1 | (uint)((depth * -0x55555555 & 1U) != 0) << 0x1f) <
           0x2aaaaaab)) &&
         ((uVar5 = (this->m_limits).maxTexture2DSize, width <= (int)uVar5 &&
          (depth <= (this->m_limits).maxTexture2DArrayLayers)))) {
        if (uVar5 == 0) {
          uVar4 = 0x20;
        }
        else {
          uVar4 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = uVar4 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar4)) {
          pTVar13 = &local_188->defaultCubeArrayTex;
          if (local_188->texCubeArrayBinding != (TextureCubeArray *)0x0) {
            pTVar13 = local_188->texCubeArrayBinding;
          }
          if ((pTVar13->super_Texture).m_immutable == true) {
            if ((((0xd < (uint)level) ||
                 (*(long *)((long)((pTVar13->m_levels).m_data + (uint)level) + 8) == 0)) ||
                (uVar3 = *(undefined8 *)((pTVar13->m_levels).m_access + (uint)level),
                local_190.order != (ChannelOrder)uVar3)) ||
               (((local_190.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                 (*(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 8) != width)) ||
                ((*(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 0xc) != height ||
                 (*(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 0x10) != depth))))))
            goto LAB_018d538d;
          }
          else {
            rc::TextureLevelArray::allocLevel
                      (&pTVar13->m_levels,level,&local_190,width,height,depth);
          }
          if (local_150 == (pointer)0x0) {
            pTVar6 = (TextureFormat *)((pTVar13->m_levels).m_access + level);
            local_120.super_ConstPixelBufferAccess.m_format = *pTVar6;
            lVar10 = 0;
            do {
              local_120.super_ConstPixelBufferAccess.m_size.m_data[lVar10] =
                   (&pTVar6[1].order)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            lVar10 = 0;
            do {
              local_120.super_ConstPixelBufferAccess.m_pitch.m_data[lVar10] =
                   (&pTVar6[2].type)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            TVar8 = pTVar6[4];
            pPVar7 = &local_120;
            goto LAB_018d5570;
          }
          getUnpack3DAccess(&local_148,this,&local_180,width,height,depth,local_150);
          pPVar7 = (pTVar13->m_levels).m_access + level;
          local_178 = (pPVar7->super_ConstPixelBufferAccess).m_format;
          lVar10 = 0;
          do {
            auStack_170[lVar10] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            auStack_170[lVar10 + 3] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 0x14);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          goto LAB_018d5441;
        }
      }
    }
    else {
      if (target != 0x8c1a) goto LAB_018d4ae4;
      uVar5 = (this->m_limits).maxTexture2DSize;
      if (((width <= (int)uVar5) && (height <= (int)uVar5)) &&
         (depth <= (this->m_limits).maxTexture2DArrayLayers)) {
        if (uVar5 == 0) {
          uVar4 = 0x20;
        }
        else {
          uVar4 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = uVar4 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar4)) {
          pTVar12 = &local_188->default2DArrayTex;
          if (local_188->tex2DArrayBinding != (Texture2DArray *)0x0) {
            pTVar12 = local_188->tex2DArrayBinding;
          }
          if ((pTVar12->super_Texture).m_immutable == true) {
            if (((((0xd < (uint)level) ||
                  (*(long *)((long)((pTVar12->m_levels).m_data + (uint)level) + 8) == 0)) ||
                 (uVar3 = *(undefined8 *)((pTVar12->m_levels).m_access + (uint)level),
                 local_190.order != (ChannelOrder)uVar3)) ||
                ((local_190.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
                 (*(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 8) != width)))) ||
               ((*(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 0xc) != height ||
                (*(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 0x10) != depth))))
            goto LAB_018d538d;
          }
          else {
            rc::TextureLevelArray::allocLevel
                      (&pTVar12->m_levels,level,&local_190,width,height,depth);
          }
          if (local_150 == (pointer)0x0) {
            pTVar6 = (TextureFormat *)((pTVar12->m_levels).m_access + level);
            local_d0.super_ConstPixelBufferAccess.m_format = *pTVar6;
            lVar10 = 0;
            do {
              local_d0.super_ConstPixelBufferAccess.m_size.m_data[lVar10] =
                   (&pTVar6[1].order)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            lVar10 = 0;
            do {
              local_d0.super_ConstPixelBufferAccess.m_pitch.m_data[lVar10] =
                   (&pTVar6[2].type)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            TVar8 = pTVar6[4];
            pPVar7 = &local_d0;
            goto LAB_018d5570;
          }
          getUnpack3DAccess(&local_148,this,&local_180,width,height,depth,local_150);
          pPVar7 = (pTVar12->m_levels).m_access + level;
          local_178 = (pPVar7->super_ConstPixelBufferAccess).m_format;
          lVar10 = 0;
          do {
            auStack_170[lVar10] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            auStack_170[lVar10 + 3] =
                 *(undefined4 *)((long)&pPVar7->super_ConstPixelBufferAccess + lVar10 * 4 + 0x14);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          goto LAB_018d5441;
        }
      }
    }
  }
LAB_018d490d:
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::texImage3D (deUint32 target, int level, deUint32 internalFormat, int width, int height, int depth, int border, deUint32 format, deUint32 type, const void* data)
{
	TextureUnit&		unit					= m_textureUnits[m_activeTexture];
	const void*			unpackPtr				= getPixelUnpackPtr(data);
	const bool			isDstFloatDepthFormat	= (internalFormat == GL_DEPTH_COMPONENT32F || internalFormat == GL_DEPTH32F_STENCIL8); // depth components are limited to [0,1] range
	TextureFormat		storageFmt;
	TextureFormat		transferFmt;

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || depth < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	// Map transfer format.
	transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D && glu::isContextTypeGLCore(m_limits.contextType))
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height != 1 || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, 1, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getFace(level, face));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getFace(level, face));
		}
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture2DSize ||
					height	> m_limits.maxTexture2DSize ||
					depth	> m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2DArray* texture = unit.tex2DArrayBinding ? unit.tex2DArrayBinding : &unit.default2DArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_3D)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture3DSize ||
					height	> m_limits.maxTexture3DSize ||
					depth	> m_limits.maxTexture3DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture3DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture3D* texture = unit.tex3DBinding ? unit.tex3DBinding : &unit.default3DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width		!= height						||
					width		 > m_limits.maxTexture2DSize	||
					depth % 6	!= 0							||
					depth		 > m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCubeArray* texture = unit.texCubeArrayBinding ? unit.texCubeArrayBinding : &unit.defaultCubeArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}